

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# annotator.cpp
# Opt level: O2

VariablePairPtr __thiscall libcellml::Annotator::connection(Annotator *this,string *id,size_t index)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  VariablePairPtr VVar1;
  Annotator local_20;
  
  item(&local_20,id,index);
  AnyCellmlElement::variablePair((AnyCellmlElement *)this);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_20.super_Logger.mPimpl);
  VVar1.super___shared_ptr<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  VVar1.super___shared_ptr<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (VariablePairPtr)
         VVar1.super___shared_ptr<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

VariablePairPtr Annotator::connection(const std::string &id, size_t index)
{
    return item(id, index)->variablePair();
}